

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::ShaderMatrixCase::setupUniforms
          (ShaderMatrixCase *this,int programID,Vec4 *constCoords)

{
  code *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 uVar3;
  float *pfVar4;
  ShaderInput *local_140;
  Array<float,_16> local_12c;
  Array<float,_9> local_ec;
  Matrix<float,_2,_2> local_c8;
  string local_b8;
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  int local_3c;
  ShaderInput *pSStack_38;
  int loc;
  ShaderInput *in;
  long lStack_28;
  int inNdx;
  Functions *gl;
  Vec4 *constCoords_local;
  ShaderMatrixCase *pSStack_10;
  int programID_local;
  ShaderMatrixCase *this_local;
  
  gl = (Functions *)constCoords;
  constCoords_local._4_4_ = programID;
  pSStack_10 = this;
  iVar2 = (*((this->super_ShaderRenderCase).m_renderCtx)->_vptr_RenderContext[3])();
  lStack_28 = CONCAT44(extraout_var,iVar2);
  for (in._4_4_ = 0; iVar2 = constCoords_local._4_4_, in._4_4_ < 2; in._4_4_ = in._4_4_ + 1) {
    if (in._4_4_ < 1) {
      local_140 = &this->m_in0;
    }
    else {
      local_140 = &this->m_in1;
    }
    pSStack_38 = local_140;
    if (local_140->inputType == INPUTTYPE_UNIFORM) {
      pcVar1 = *(code **)(lStack_28 + 0xb48);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"u_in",&local_81);
      de::toString<int>(&local_b8,(int *)((long)&in + 4));
      std::operator+(&local_60,&local_80,&local_b8);
      uVar3 = std::__cxx11::string::c_str();
      iVar2 = (*pcVar1)(iVar2,uVar3);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator(&local_81);
      local_3c = iVar2;
      if (-1 < iVar2) {
        switch(pSStack_38->dataType) {
        case TYPE_FLOAT:
          (**(code **)(lStack_28 + 0x14e0))
                    (*(undefined4 *)((long)&s_constInFloat + (long)in._4_4_ * 4),iVar2);
          break;
        case TYPE_FLOAT_VEC2:
          pcVar1 = *(code **)(lStack_28 + 0x1528);
          pfVar4 = tcu::Vector<float,_2>::getPtr
                             ((Vector<float,_2> *)(s_constInVec2 + (long)in._4_4_ * 8));
          (*pcVar1)(iVar2,1,pfVar4);
          break;
        case TYPE_FLOAT_VEC3:
          pcVar1 = *(code **)(lStack_28 + 0x1568);
          pfVar4 = tcu::Vector<float,_3>::getPtr
                             ((Vector<float,_3> *)(s_constInVec3 + (long)in._4_4_ * 0xc));
          (*pcVar1)(iVar2,1,pfVar4);
          break;
        case TYPE_FLOAT_VEC4:
          pcVar1 = *(code **)(lStack_28 + 0x15a8);
          pfVar4 = tcu::Vector<float,_4>::getPtr
                             ((Vector<float,_4> *)(s_constInVec4 + (long)in._4_4_ * 0x10));
          (*pcVar1)(iVar2,1,pfVar4);
          break;
        case TYPE_FLOAT_MAT2:
          pcVar1 = *(code **)(lStack_28 + 0x15e0);
          tcu::Matrix<float,_2,_2>::getColumnMajorData(&local_c8);
          pfVar4 = tcu::Array<float,_4>::getPtr((Array<float,_4> *)&local_c8);
          (*pcVar1)(iVar2,1,0,pfVar4);
          tcu::Array<float,_4>::~Array((Array<float,_4> *)&local_c8);
          break;
        default:
          break;
        case TYPE_FLOAT_MAT3:
          pcVar1 = *(code **)(lStack_28 + 0x1610);
          tcu::Matrix<float,_3,_3>::getColumnMajorData
                    (&local_ec,(Matrix<float,_3,_3> *)(s_constInMat3 + (long)in._4_4_ * 0x24));
          pfVar4 = tcu::Array<float,_9>::getPtr(&local_ec);
          (*pcVar1)(iVar2,1,0,pfVar4);
          tcu::Array<float,_9>::~Array(&local_ec);
          break;
        case TYPE_FLOAT_MAT4:
          pcVar1 = *(code **)(lStack_28 + 0x1640);
          tcu::Matrix<float,_4,_4>::getColumnMajorData
                    (&local_12c,(Matrix<float,_4,_4> *)(s_constInMat4 + (long)in._4_4_ * 0x40));
          pfVar4 = tcu::Array<float,_16>::getPtr(&local_12c);
          (*pcVar1)(iVar2,1,0,pfVar4);
          tcu::Array<float,_16>::~Array(&local_12c);
        }
      }
    }
  }
  return;
}

Assistant:

void ShaderMatrixCase::setupUniforms (int programID, const tcu::Vec4& constCoords)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	DE_UNREF(constCoords);

	for (int inNdx = 0; inNdx < 2; inNdx++)
	{
		const ShaderInput& in = inNdx > 0 ? m_in1 : m_in0;

		if (in.inputType == INPUTTYPE_UNIFORM)
		{
			int loc = gl.getUniformLocation(programID, (string("u_in") + de::toString(inNdx)).c_str());

			if (loc < 0)
				continue;

			switch (in.dataType)
			{
				case TYPE_FLOAT:		gl.uniform1f(loc, s_constInFloat[inNdx]);													break;
				case TYPE_FLOAT_VEC2:	gl.uniform2fv(loc, 1, s_constInVec2[inNdx].getPtr());										break;
				case TYPE_FLOAT_VEC3:	gl.uniform3fv(loc, 1, s_constInVec3[inNdx].getPtr());										break;
				case TYPE_FLOAT_VEC4:	gl.uniform4fv(loc, 1, s_constInVec4[inNdx].getPtr());										break;
				case TYPE_FLOAT_MAT2:	gl.uniformMatrix2fv(loc, 1, GL_FALSE, s_constInMat2[inNdx].getColumnMajorData().getPtr());	break;
				case TYPE_FLOAT_MAT3:	gl.uniformMatrix3fv(loc, 1, GL_FALSE, s_constInMat3[inNdx].getColumnMajorData().getPtr());	break;
				case TYPE_FLOAT_MAT4:	gl.uniformMatrix4fv(loc, 1, GL_FALSE, s_constInMat4[inNdx].getColumnMajorData().getPtr());	break;
				default:
					DE_ASSERT(false);
			}
		}
	}
}